

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

libcaption_stauts_t caption_frame_decode_text(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  char *c;
  uint16_t in_SI;
  char *in_RDI;
  size_t chars;
  int *in_stack_00000008;
  char char2 [5];
  char char1 [5];
  int chan;
  caption_frame_t *in_stack_ffffffffffffffe0;
  
  iVar1 = eia608_to_utf8(char1._3_2_,in_stack_00000008,(char *)chars,in_RDI);
  c = (char *)(long)iVar1;
  iVar1 = eia608_is_westeu(in_SI);
  if (iVar1 != 0) {
    caption_frame_backspace(in_stack_ffffffffffffffe0);
  }
  if (c != (char *)0x0) {
    eia608_write_char(in_stack_ffffffffffffffe0,c);
  }
  if ((char *)0x1 < c) {
    eia608_write_char(in_stack_ffffffffffffffe0,c);
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_text(caption_frame_t* frame, uint16_t cc_data)
{
    int chan;
    char char1[5], char2[5];
    size_t chars = eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);

    if (eia608_is_westeu(cc_data)) {
        // Extended charcters replace the previous charcter for back compatibility
        caption_frame_backspace(frame);
    }

    if (0 < chars) {
        eia608_write_char(frame, char1);
    }

    if (1 < chars) {
        eia608_write_char(frame, char2);
    }

    return LIBCAPTION_OK;
}